

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O0

bool __thiscall QPicture::save(QPicture *this,QIODevice *dev)

{
  char *pcVar1;
  QByteArray *this_00;
  char *in_RSI;
  QPaintDevice *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  QMessageLogger *in_stack_ffffffffffffffb0;
  bool local_29;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = QPaintDevice::paintingActive(in_RDI);
  if (local_29) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffff98);
    QMessageLogger::warning
              (local_28,"QPicture::save: still being painted on. Call QPainter::end() first");
  }
  else {
    d_func((QPicture *)0x31a486);
    QBuffer::buffer();
    pcVar1 = QByteArray::operator_cast_to_char_((QByteArray *)0x31a49a);
    d_func((QPicture *)0x31a4a9);
    this_00 = (QByteArray *)QBuffer::buffer();
    QByteArray::size(this_00);
    QIODevice::write(in_RSI,(longlong)pcVar1);
  }
  local_29 = !local_29;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QPicture::save(QIODevice *dev)
{
    if (paintingActive()) {
        qWarning("QPicture::save: still being painted on. "
                  "Call QPainter::end() first");
        return false;
    }

    dev->write(d_func()->pictb.buffer(), d_func()->pictb.buffer().size());
    return true;
}